

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O2

void __thiscall serial::IOException::IOException(IOException *this,string *file,int line,int errnum)

{
  char *pcVar1;
  ostream *poVar2;
  stringstream ss;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  (this->super_SerialException).e_what_._M_dataplus._M_p =
       (pointer)&(this->super_SerialException).e_what_.field_2;
  (this->super_SerialException).e_what_._M_string_length = 0;
  (this->super_SerialException).e_what_.field_2._M_local_buf[0] = '\0';
  *(undefined ***)&this->super_SerialException = &PTR__IOException_00111d60;
  std::__cxx11::string::string((string *)&this->file_,(string *)file);
  this->line_ = line;
  (this->e_what_)._M_dataplus._M_p = (pointer)&(this->e_what_).field_2;
  (this->e_what_)._M_string_length = 0;
  (this->e_what_).field_2._M_local_buf[0] = '\0';
  this->errno_ = errnum;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar1 = strerror(errnum);
  poVar2 = std::operator<<(local_1a8,"IO Exception (");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->errno_);
  poVar2 = std::operator<<(poVar2,"): ");
  std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(local_1a8,", file ");
  poVar2 = std::operator<<(poVar2,(string *)&this->file_);
  poVar2 = std::operator<<(poVar2,", line ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->line_);
  std::operator<<(poVar2,".");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->e_what_,asStack_1d8);
  std::__cxx11::string::~string(asStack_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

explicit IOException (std::string file, int line, int errnum)
    : file_(file), line_(line), errno_(errnum) {
      std::stringstream ss;
#if defined(_WIN32) && !defined(__MINGW32__)
      char error_str [1024];
      strerror_s(error_str, 1024, errnum);
#else
      char * error_str = strerror(errnum);
#endif
      ss << "IO Exception (" << errno_ << "): " << error_str;
      ss << ", file " << file_ << ", line " << line_ << ".";
      e_what_ = ss.str();
  }